

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

char * jas_stream_gets(jas_stream_t *stream,char *buf,int bufsize)

{
  byte *pbVar1;
  int iVar2;
  char *pcVar3;
  uint local_34;
  uint local_30;
  uint local_2c;
  char *local_28;
  char *bufptr;
  int c;
  int bufsize_local;
  char *buf_local;
  jas_stream_t *stream_local;
  
  if (bufsize < 1) {
    __assert_fail("bufsize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x2e4,"char *jas_stream_gets(jas_stream_t *, char *, int)");
  }
  iVar2 = jas_getdbglevel();
  local_28 = buf;
  bufptr._4_4_ = bufsize;
  if (99 < iVar2) {
    jas_eprintf("jas_stream_gets(%p, %p, %d)\n",stream,buf,(ulong)(uint)bufsize);
    local_28 = buf;
  }
  do {
    if (bufptr._4_4_ < 2) break;
    if ((stream->flags_ & 7U) == 0) {
      if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
        iVar2 = stream->cnt_ + -1;
        stream->cnt_ = iVar2;
        if (iVar2 < 0) {
          local_30 = jas_stream_fillbuf(stream,1);
        }
        else {
          stream->rwcnt_ = stream->rwcnt_ + 1;
          pbVar1 = stream->ptr_;
          stream->ptr_ = pbVar1 + 1;
          local_30 = (uint)*pbVar1;
        }
        local_2c = local_30;
      }
      else {
        stream->flags_ = stream->flags_ | 4;
        local_2c = 0xffffffff;
      }
      local_34 = local_2c;
    }
    else {
      local_34 = 0xffffffff;
    }
    if (local_34 == 0xffffffff) break;
    pcVar3 = local_28 + 1;
    *local_28 = (char)local_34;
    bufptr._4_4_ = bufptr._4_4_ + -1;
    local_28 = pcVar3;
  } while (local_34 != 10);
  *local_28 = '\0';
  return buf;
}

Assistant:

char *jas_stream_gets(jas_stream_t *stream, char *buf, int bufsize)
{
	int c;
	char *bufptr;
	assert(bufsize > 0);

	JAS_DBGLOG(100, ("jas_stream_gets(%p, %p, %d)\n", stream, buf, bufsize));

	bufptr = buf;
	while (bufsize > 1) {
		if ((c = jas_stream_getc(stream)) == EOF) {
			break;
		}
		*bufptr++ = c;
		--bufsize;
		if (c == '\n') {
			break;
		}
	}
	*bufptr = '\0';
	return buf;
}